

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application_glfw.cpp
# Opt level: O2

void __thiscall Application::createWindow(Application *this,string *windowName,int width,int height)

{
  int iVar1;
  undefined8 in_RAX;
  GLFWwindow *handle;
  int local_24 [2];
  int frameBufferWidth;
  
  local_24[0] = (int)((ulong)in_RAX >> 0x20);
  std::__cxx11::string::_M_assign((string *)&this->_windowName);
  this->_windowWidth = width;
  this->_windowHeight = height;
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    fwrite("Failed to initialize GLFW\n",0x1a,1,_stderr);
  }
  else {
    glfwWindowHint(0x21005,0x10);
    glfwWindowHint(0x2000a,1);
    handle = glfwCreateWindow(width,height,(this->_windowName)._M_dataplus._M_p,(GLFWmonitor *)0x0,
                              (GLFWwindow *)0x0);
    this->_window = handle;
    if (handle != (GLFWwindow *)0x0) {
      glfwSetWindowUserPointer(handle,this);
      glfwSetFramebufferSizeCallback(this->_window,_sizeCallback);
      glfwMakeContextCurrent(this->_window);
      gladLoadGL(glfwGetProcAddress);
      glfwSwapInterval((uint)this->vsyncEnabled);
      _reshapeFrustum(this,width,height);
      glfwGetFramebufferSize(this->_window,local_24,(int *)0x0);
      this->screenScale = (float)local_24[0] / (float)width;
      printf("screen scale detected: %f",(double)((float)local_24[0] / (float)width));
      putchar(10);
      fflush(_stdout);
      return;
    }
    fwrite("Failed to open GLFW window\n",0x1b,1,_stderr);
    glfwTerminate();
  }
  exit(1);
}

Assistant:

void Application::createWindow(std::string windowName, int width, int height) {
    _windowName = windowName;
    _windowWidth = width;
    _windowHeight = height;

    if (!glfwInit()) {
        fprintf( stderr, "Failed to initialize GLFW\n" );
        exit( EXIT_FAILURE );
    }

    glfwWindowHint(GLFW_DEPTH_BITS, 16);
    glfwWindowHint(GLFW_TRANSPARENT_FRAMEBUFFER, GLFW_TRUE);

    _window = glfwCreateWindow(width, height, _windowName.c_str(), NULL, NULL);
    if (!_window) {
        fprintf(stderr, "Failed to open GLFW window\n");
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    // Set callback functions
    glfwSetWindowUserPointer(_window, this);
    glfwSetFramebufferSizeCallback(_window, _sizeCallback);

    // Lock to (probably) 60fps if vsyncEnabled, or unlock framerate
    glfwMakeContextCurrent(_window);
    gladLoadGL(glfwGetProcAddress);
    glfwSwapInterval(vsyncEnabled ? 1 : 0);

    // Setup the frame buffer and view port size
    _reshapeFrustum(width, height);
    //_reshapeOrtho(width, height); // Don't seem to need to set ortho size here...

    // Detect screen scale by comparing window size to framebuffer size
    int frameBufferWidth;
    glfwGetFramebufferSize(_window, &frameBufferWidth, NULL);
    screenScale = (float)frameBufferWidth / (float)width;
    DEBUG_PRINTLN("screen scale detected: %f", screenScale);
}